

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeMeasure.h
# Opt level: O0

void __thiscall dg::debug::TimeMeasure::report(TimeMeasure *this,string *prefix,ostream *out)

{
  ostream *poVar1;
  rep rVar2;
  ostream *in_RDX;
  string *in_RSI;
  TimeMeasure *in_RDI;
  rep sec;
  rep msec;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffb8;
  duration<long,_std::ratio<1L,_1L>_> local_38;
  rep local_30;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  long local_20;
  ostream *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  duration(in_RDI);
  poVar1 = std::operator<<(local_18,local_10);
  std::operator<<(poVar1," ");
  local_28.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_ffffffffffffffb8);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_28);
  local_20 = rVar2 % 1000;
  local_38.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_ffffffffffffffb8);
  local_30 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_38);
  poVar1 = (ostream *)std::ostream::operator<<(local_18,local_30);
  poVar1 = std::operator<<(poVar1," sec ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
  poVar1 = std::operator<<(poVar1," ms");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void report(const std::string &prefix = "", std::ostream &out = std::cerr) {
        // compute the duration
        duration();

        out << prefix << " ";

        const auto msec =
                std::chrono::duration_cast<std::chrono::milliseconds>(elapsed)
                        .count() %
                ms_in_sec;
        const auto sec =
                std::chrono::duration_cast<std::chrono::seconds>(elapsed)
                        .count();
        out << sec << " sec " << msec << " ms" << std::endl;
    }